

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  secp256k1_fe *psVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  secp256k1_fe *psVar69;
  secp256k1_ge *r;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  secp256k1_fe zs;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_gej tmpa;
  secp256k1_fe local_f8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  secp256k1_gej local_b8;
  
  lVar66 = len - 1;
  if (len != 0) {
    secp256k1_fe_normalize_weak(&a[lVar66].y);
    local_f8.n[4] = zr[lVar66].n[4];
    local_f8.n[0] = zr[lVar66].n[0];
    local_f8.n[1] = zr[lVar66].n[1];
    local_f8.n[2] = zr[lVar66].n[2];
    local_f8.n[3] = (zr[lVar66].n + 2)[1];
    if (lVar66 != 0) {
      r = a + (len - 2);
      lVar72 = 0;
      psVar57 = zr + len;
      do {
        psVar69 = psVar57 + -1;
        if (lVar72 != 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = psVar69->n[0];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_f8.n[3];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar57[-1].n[1];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_f8.n[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = psVar57[-1].n[2];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_f8.n[1];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = psVar57[-1].n[3];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_f8.n[0];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = psVar57[-1].n[4];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_f8.n[4];
          uVar67 = SUB168(auVar5 * auVar35,0);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar67 & 0xfffffffffffff;
          auVar1 = auVar2 * auVar32 + auVar1 * auVar31 + auVar3 * auVar33 + auVar4 * auVar34 +
                   auVar6 * ZEXT816(0x1000003d10);
          uVar68 = auVar1._0_8_;
          local_c0 = uVar68 & 0xfffffffffffff;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar68 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = psVar69->n[0];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_f8.n[4];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = psVar57[-1].n[1];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_f8.n[3];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = psVar57[-1].n[2];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_f8.n[2];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = psVar57[-1].n[3];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_f8.n[1];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = psVar57[-1].n[4];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_f8.n[0];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar67 >> 0x34 | SUB168(auVar5 * auVar35,8) << 0xc;
          auVar1 = auVar7 * auVar36 + auVar58 + auVar8 * auVar37 + auVar9 * auVar38 +
                   auVar10 * auVar39 + auVar11 * auVar40 + auVar12 * ZEXT816(0x1000003d10);
          local_c8 = auVar1._0_8_;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_c8 >> 0x34 | auVar1._8_8_ << 0xc;
          local_d0 = (local_c8 & 0xfffffffffffff) >> 0x30;
          local_c8 = local_c8 & 0xffffffffffff;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = psVar69->n[0];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_f8.n[0];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = psVar57[-1].n[1];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_f8.n[4];
          auVar15._8_8_ = 0;
          auVar15._0_8_ = psVar57[-1].n[2];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_f8.n[3];
          auVar16._8_8_ = 0;
          auVar16._0_8_ = psVar57[-1].n[3];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_f8.n[2];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = psVar57[-1].n[4];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_f8.n[1];
          auVar1 = auVar14 * auVar42 + auVar60 + auVar15 * auVar43 + auVar16 * auVar44 +
                   auVar17 * auVar45;
          uVar67 = auVar1._0_8_;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar67 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = (uVar67 & 0xfffffffffffff) << 4 | local_d0;
          uVar68 = auVar59._0_8_;
          auVar59 = auVar13 * auVar41 + ZEXT816(0x1000003d1) * auVar46;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar68 >> 0x34 | auVar59._8_8_ << 0xc;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = psVar69->n[0];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_f8.n[1];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = psVar57[-1].n[1];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_f8.n[0];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = psVar57[-1].n[2];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_f8.n[4];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = psVar57[-1].n[3];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_f8.n[3];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = psVar57[-1].n[4];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_f8.n[2];
          auVar2 = auVar20 * auVar49 + auVar62 + auVar21 * auVar50 + auVar22 * auVar51;
          uVar67 = auVar2._0_8_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar67 & 0xfffffffffffff;
          auVar1 = auVar18 * auVar47 + auVar61 + auVar19 * auVar48 + auVar23 * ZEXT816(0x1000003d10)
          ;
          uVar70 = auVar1._0_8_;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar67 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar70 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = psVar69->n[0];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_f8.n[2];
          auVar25._8_8_ = 0;
          auVar25._0_8_ = psVar57[-1].n[1];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_f8.n[1];
          auVar26._8_8_ = 0;
          auVar26._0_8_ = psVar57[-1].n[2];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_f8.n[0];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = psVar57[-1].n[3];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_f8.n[4];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = psVar57[-1].n[4];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = local_f8.n[3];
          auVar2 = auVar27 * auVar55 + auVar64 + auVar28 * auVar56;
          uVar67 = auVar2._0_8_;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar67 & 0xfffffffffffff;
          auVar1 = auVar24 * auVar52 + auVar63 + auVar25 * auVar53 + auVar26 * auVar54 +
                   auVar29 * ZEXT816(0x1000003d10);
          uVar71 = auVar1._0_8_;
          local_f8.n[2] = uVar71 & 0xfffffffffffff;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = (uVar71 >> 0x34 | auVar1._8_8_ << 0xc) + local_c0;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar67 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar65 = auVar30 * ZEXT816(0x1000003d10) + auVar65;
          uVar67 = auVar65._0_8_;
          local_f8.n[3] = uVar67 & 0xfffffffffffff;
          local_f8.n[4] = (uVar67 >> 0x34 | auVar65._8_8_ << 0xc) + local_c8;
          local_f8.n[0] = uVar68 & 0xfffffffffffff;
          local_f8.n[1] = uVar70 & 0xfffffffffffff;
        }
        local_b8.x.n[4] = (r->x).n[4];
        local_b8.x.n[0] = (r->x).n[0];
        local_b8.x.n[1] = (r->x).n[1];
        local_b8.x.n[2] = (r->x).n[2];
        local_b8.x.n[3] = (r->x).n[3];
        local_b8.y.n[4] = (r->y).n[4];
        local_b8.y.n[0] = (r->y).n[0];
        local_b8.y.n[1] = (r->y).n[1];
        local_b8.y.n[2] = (r->y).n[2];
        local_b8.y.n[3] = (r->y).n[3];
        local_b8.infinity = 0;
        secp256k1_ge_set_gej_zinv(r,&local_b8,&local_f8);
        lVar72 = lVar72 + 1;
        r = r + -1;
        psVar57 = psVar69;
      } while (lVar66 != lVar72);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            secp256k1_gej tmpa;
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            tmpa.x = a[i].x;
            tmpa.y = a[i].y;
            tmpa.infinity = 0;
            secp256k1_ge_set_gej_zinv(&a[i], &tmpa, &zs);
        }
    }
}